

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O3

int __thiscall
amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>::getBoxType_Cpu
          (GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *this,Box *bx,Geometry *geom)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Real RVar9;
  int local_48;
  
  iVar1 = ((bx->bigend).vect[2] - (bx->smallend).vect[2]) + 1;
  if (iVar1 < 1) {
    uVar3 = 0xffffffff;
  }
  else {
    iVar2 = ((bx->bigend).vect[0] - (bx->smallend).vect[0]) + 1;
    iVar4 = ((bx->bigend).vect[1] - (bx->smallend).vect[1]) + 1;
    iVar5 = 0;
    local_48 = 0;
    iVar7 = 0;
    do {
      if (0 < iVar4) {
        iVar8 = 0;
        do {
          if (0 < iVar2) {
            iVar6 = 0;
            do {
              RVar9 = ParserIF::operator()
                                (&this->m_f,
                                 (double)((bx->smallend).vect[0] + iVar6) *
                                 (geom->super_CoordSys).dx[0] + (geom->prob_domain).xlo[0],
                                 (double)((bx->smallend).vect[1] + iVar8) *
                                 (geom->super_CoordSys).dx[1] + (geom->prob_domain).xlo[1],
                                 (double)((bx->smallend).vect[2] + iVar5) *
                                 (geom->super_CoordSys).dx[2] + (geom->prob_domain).xlo[2]);
              if ((RVar9 != 0.0) || (NAN(RVar9))) {
                if (RVar9 <= 0.0) {
                  local_48 = local_48 + 1;
                }
                else {
                  iVar7 = iVar7 + 1;
                }
              }
              if ((0 < iVar7) && (0 < local_48)) {
                return 0;
              }
              iVar6 = iVar6 + 1;
            } while (iVar2 != iVar6);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar4);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar1);
    uVar3 = -(uint)(iVar7 == 0) | (uint)(local_48 == 0);
  }
  return uVar3;
}

Assistant:

int getBoxType_Cpu (const Box& bx, Geometry const& geom) const noexcept
    {
        const Real* problo = geom.ProbLo();
        const Real* dx = geom.CellSize();
        const auto& len3 = bx.length3d();
        const int* blo = bx.loVect();
        int nbody = 0, nzero = 0, nfluid = 0;
        for         (int k = 0; k < len3[2]; ++k) {
            for     (int j = 0; j < len3[1]; ++j) {
                for (int i = 0; i < len3[0]; ++i) {
                    RealArray xyz {AMREX_D_DECL(problo[0]+(i+blo[0])*dx[0],
                                                problo[1]+(j+blo[1])*dx[1],
                                                problo[2]+(k+blo[2])*dx[2])};
                    Real v = m_f(xyz);
                    if (v == 0.0_rt) {
                        ++nzero;
                    } else if (v > 0.0_rt) {
                        ++nbody;
                    } else {
                        ++nfluid;
                    }
                    if (nbody > 0 && nfluid > 0) return mixedcells;
                }
            }
        }

        if (nbody == 0) {
            return allregular;
        } else if (nfluid == 0) {
            return allcovered;
        } else {
            return mixedcells;
        }
    }